

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# surface_mesh.cpp
# Opt level: O0

void __thiscall geometrycentral::surface::SurfaceMesh::compress(SurfaceMesh *this)

{
  bool bVar1;
  SurfaceMesh *in_RDI;
  function<void_()> *f;
  iterator __end2;
  iterator __begin2;
  list<std::function<void_()>,_std::allocator<std::function<void_()>_>_> *__range2;
  SurfaceMesh *in_stack_00000080;
  SurfaceMesh *in_stack_000000c0;
  SurfaceMesh *in_stack_000000d0;
  SurfaceMesh *in_stack_00000200;
  list<std::function<void_()>,_std::allocator<std::function<void_()>_>_> *in_stack_ffffffffffffffc8;
  _Self local_20;
  _Self local_18;
  list<std::function<void_()>,_std::allocator<std::function<void_()>_>_> *local_10;
  
  bVar1 = isCompressed(in_RDI);
  if (!bVar1) {
    compressHalfedges(in_stack_00000200);
    compressEdges(in_stack_00000080);
    compressFaces(in_stack_000000d0);
    compressVertices(in_stack_000000c0);
    in_RDI->isCompressedFlag = true;
    local_10 = &in_RDI->compressCallbackList;
    local_18._M_node =
         (_List_node_base *)
         ::std::__cxx11::list<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::
         begin(in_stack_ffffffffffffffc8);
    local_20._M_node =
         (_List_node_base *)
         ::std::__cxx11::list<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::end
                   (in_stack_ffffffffffffffc8);
    while (bVar1 = ::std::operator!=(&local_18,&local_20), bVar1) {
      ::std::_List_iterator<std::function<void_()>_>::operator*
                ((_List_iterator<std::function<void_()>_> *)0x1d643f);
      ::std::function<void_()>::operator()((function<void_()> *)in_RDI);
      ::std::_List_iterator<std::function<void_()>_>::operator++(&local_18);
    }
  }
  return;
}

Assistant:

void SurfaceMesh::compress() {
  if (isCompressed()) {
    return;
  }

  compressHalfedges();
  compressEdges();
  compressFaces();
  compressVertices();
  isCompressedFlag = true;

  for (auto& f : compressCallbackList) {
    f();
  }
}